

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O1

size_t json_dumpb(json_t *json,char *buffer,size_t size,size_t flags)

{
  int iVar1;
  bool bVar2;
  buffer buf;
  size_t local_18;
  size_t local_10;
  char *local_8;
  
  local_10 = 0;
  if ((((uint)flags >> 9 & 1) == 0) && ((json == (json_t *)0x0 || (JSON_ARRAY < json->type)))) {
    bVar2 = false;
  }
  else {
    local_18 = size;
    local_8 = buffer;
    iVar1 = do_dump(json,flags,0,dump_to_buffer,&local_18);
    bVar2 = iVar1 == 0;
  }
  if (!bVar2) {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

size_t json_dumpb(const json_t *json, char *buffer, size_t size, size_t flags)
{
	struct buffer buf = { size, 0, buffer };

	if (json_dump_callback(json, dump_to_buffer, (void *)&buf, flags))
		return 0;

	return buf.used;
}